

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long *plVar2;
  char cVar3;
  _Bool _Var4;
  Curl_cfilter *pCVar5;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"data_pending");
    }
    plVar2 = *(long **)((long)pvVar1 + 0x30);
    if (((plVar2 != (long *)0x0) && (*(int *)((long)pvVar1 + 0x38) == 0)) &&
       (cVar3 = (**(code **)(*plVar2 + 0x38))(plVar2,data), cVar3 != '\0')) {
      return true;
    }
    pCVar5 = *(Curl_cfilter **)((long)pvVar1 + 0x60);
    if ((pCVar5 == (Curl_cfilter *)0x0) || (*(int *)((long)pvVar1 + 0x68) != 0)) {
      return false;
    }
  }
  else {
    pCVar5 = cf->next;
  }
  _Var4 = (*pCVar5->cft->has_data_pending)(pCVar5,data);
  return _Var4;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  CURL_TRC_CF((struct Curl_easy *)data, cf, "data_pending");
  return cf_hc_baller_data_pending(&ctx->h3_baller, data)
         || cf_hc_baller_data_pending(&ctx->h21_baller, data);
}